

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9a8b::MemoryMappedFileTest_DtorUnmapsFile_Test::TestBody
          (MemoryMappedFileTest_DtorUnmapsFile_Test *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t size;
  char *message;
  StringRef data;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  File file;
  string filename;
  MemoryMappedFile<fmt::File> f;
  
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  std::operator+(&filename,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 "/test");
  std::__cxx11::string::~string((string *)&f);
  data.size_ = 3;
  data.data_ = "abc";
  WriteFile((CStringRef)filename._M_dataplus._M_p,data);
  fmt::File::File(&file,(CStringRef)filename._M_dataplus._M_p,0);
  size = fmt::File::size(&file);
  mp::MemoryMappedFile<fmt::File>::MemoryMappedFile(&f,&file,size);
  mp::internal::MemoryMappedFileBase::~MemoryMappedFileBase(&f.super_MemoryMappedFileBase);
  fmt::File::~File(&file);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init((RE *)&f,"");
    bVar2 = testing::internal::DeathTest::Create
                      ("(void)*start",(RE *)&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc"
                       ,0x11f,&gtest_dt);
    if (bVar2) {
      if (gtest_dt != (DeathTest *)0x0) {
        gtest_dt_ptr.ptr_ = gtest_dt;
        iVar3 = (*gtest_dt->_vptr_DeathTest[2])();
        if (iVar3 == 0) {
          iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
          bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
          iVar3 = (*gtest_dt->_vptr_DeathTest[4])(gtest_dt,(ulong)bVar2);
          if ((char)iVar3 != '\0') goto LAB_00110275;
          bVar2 = true;
          bVar1 = false;
        }
        else {
          if (iVar3 == 1) {
            gtest_sentinel.test_ = gtest_dt;
            testing::internal::AlwaysTrue();
            (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
          }
LAB_00110275:
          bVar2 = false;
          bVar1 = true;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
        if (!bVar1) goto LAB_0011028b;
      }
      bVar2 = false;
    }
    else {
      bVar2 = true;
    }
LAB_0011028b:
    testing::internal::RE::~RE((RE *)&f);
    if (!bVar2) goto LAB_001102e7;
  }
  testing::Message::Message((Message *)&f);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&file,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x11f,
             message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&file,(Message *)&f);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&file);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&f);
LAB_001102e7:
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DtorUnmapsFile) {
  std::string filename = GetExecutableDir() + "/test";
  WriteFile(filename, "abc");
  const volatile char *start = 0;
  {
    File file(filename, File::RDONLY);
    MemoryMappedFile<> f(file, static_cast<std::size_t>(file.size()));
    start = f.start();
  }
  EXPECT_DEATH((void)*start, "");
}